

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplaceRealloc<>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,pointer pos)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  size_type sVar4;
  undefined8 uVar5;
  pointer pLVar6;
  pointer pLVar7;
  pointer pLVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar10 = this->len + 1;
  uVar3 = this->cap;
  if (uVar10 < uVar3 * 2) {
    uVar10 = uVar3 * 2;
  }
  if (0x555555555555555 - uVar3 < uVar3) {
    uVar10 = 0x555555555555555;
  }
  lVar11 = (long)pos - (long)this->data_;
  pLVar8 = (pointer)operator_new(uVar10 * 0x18);
  *(undefined8 *)((long)pLVar8 + lVar11) = 0;
  ((undefined8 *)((long)pLVar8 + lVar11))[1] = 0;
  *(undefined8 *)((long)pLVar8 + lVar11 + 0x10) = 0;
  p = this->data_;
  sVar4 = this->len;
  lVar9 = (long)p + (sVar4 * 0x18 - (long)pos);
  pLVar6 = p;
  pLVar7 = pLVar8;
  if (lVar9 == 0) {
    if (sVar4 != 0) {
      lVar9 = 0;
      do {
        *(undefined8 *)((long)&pLVar8->loopVar + lVar9) = *(undefined8 *)((long)&p->loopVar + lVar9)
        ;
        puVar1 = (undefined8 *)
                 ((long)&(p->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                         _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_payload +
                 lVar9);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&(pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                         _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_payload +
                 lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar9 = lVar9 + 0x18;
      } while (sVar4 * 0x18 != lVar9);
    }
  }
  else {
    for (; pLVar6 != pos; pLVar6 = pLVar6 + 1) {
      pLVar7->loopVar = pLVar6->loopVar;
      uVar5 = *(undefined8 *)
               &(pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_engaged;
      (pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload =
           (pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ConstantRange>._M_payload;
      *(undefined8 *)
       &(pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar5;
      pLVar7 = pLVar7 + 1;
    }
    memcpy((void *)((long)pLVar8 + lVar11 + 0x18),pos,((lVar9 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar10;
  this->data_ = pLVar8;
  return (pointer)((long)pLVar8 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}